

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerTest.cpp
# Opt level: O0

void __thiscall TestClass::TestClass(TestClass *this)

{
  Timer *pTVar1;
  EventMethod<TestClass,_Event1> *this_00;
  EventMethod<TestClass,_Event2> *this_01;
  EventMethod<TestClass,_Event3> *this_02;
  AsyncEventAgent0<TestClass> *this_03;
  uint uVar2;
  TestClass *this_local;
  
  TimerListener::TimerListener(&this->super_TimerListener);
  (this->super_TimerListener)._vptr_TimerListener = (_func_int **)&PTR_onTimeout_00108a08;
  Selector::Selector(&this->mThread,(char *)0x0);
  SmartPtr<AsyncEventAgent>::SmartPtr(&this->mPeriodEvent);
  TimerManager::getInstance();
  pTVar1 = (Timer *)TimerManager::getDefaultTimer();
  this->mDefaultTimer = pTVar1;
  this_00 = (EventMethod<TestClass,_Event1> *)
            operator_new(0x28,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/timerTest.cpp"
                         ,0x89);
  EventMethod<TestClass,_Event1>::EventMethod(this_00,this,0x104680,(IEventDispatcher *)0x0);
  this->mEvent1Handler = this_00;
  this_01 = (EventMethod<TestClass,_Event2> *)
            operator_new(0x28,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/timerTest.cpp"
                         ,0x8b);
  EventMethod<TestClass,_Event2>::EventMethod(this_01,this,0x1046f0,(IEventDispatcher *)0x0);
  this->mEvent2Handler = this_01;
  this_02 = (EventMethod<TestClass,_Event3> *)
            operator_new(0x28,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/timerTest.cpp"
                         ,0x8d);
  EventMethod<TestClass,_Event3>::EventMethod(this_02,this,0x104730,(IEventDispatcher *)0x0);
  this->mEvent3Handler = this_02;
  this_03 = (AsyncEventAgent0<TestClass> *)
            operator_new(0x30,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/timerTest.cpp"
                         ,0x8f);
  AsyncEventAgent0<TestClass>::AsyncEventAgent0(this_03,this,0x104770);
  SmartPtr<AsyncEventAgent>::operator=(&this->mPeriodEvent,(AsyncEventAgent *)this_03);
  uVar2 = (uint)this;
  Timer::addTimer((TimerListener *)this->mDefaultTimer,uVar2,2000);
  Timer::addTimer((TimerListener *)this->mDefaultTimer,uVar2,500);
  Timer::addTimer((TimerListener *)this->mDefaultTimer,uVar2,0xdac);
  Timer::addTimer((TimerListener *)this->mDefaultTimer,uVar2,0x9c4);
  this->mPeriodElapsed = 0;
  this->mPeriodCount = 0;
  return;
}

Assistant:

TestClass::TestClass()
{
	mDefaultTimer = TimerManager::getInstance()->getDefaultTimer();

	mEvent1Handler = jh_new EventMethod<TestClass,Event1>(
		this, &TestClass::ProcessFunc1, &mThread );
	mEvent2Handler = jh_new EventMethod<TestClass,Event2>(
		this, &TestClass::ProcessFunc2, &mThread );
	mEvent3Handler = jh_new EventMethod<TestClass,Event3>(
		this, &TestClass::ProcessFunc3, &mThread );
	mPeriodEvent = jh_new AsyncEventAgent0<TestClass>(
		this, &TestClass::handlePeriodic );
		
	mDefaultTimer->addTimer( this, 2000, 2345 );
	mDefaultTimer->addTimer( this, 500, 1234 );
	mDefaultTimer->addTimer( this, 3500, 4567 );
	mDefaultTimer->addTimer( this, 2500, 3456 );
	
	mPeriodElapsed = 0;
	mPeriodCount = 0;
}